

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

gguf_context * gguf_init_from_file_impl(FILE *file,gguf_init_params params)

{
  vector<gguf_kv,_std::allocator<gguf_kv>_> *kv;
  ggml_type gVar1;
  pointer pgVar2;
  pointer pgVar3;
  undefined1 auVar4 [16];
  ggml_init_params params_00;
  bool bVar5;
  gguf_type gVar6;
  ggml_context **ppgVar7;
  bool bVar8;
  __type _Var9;
  uint32_t uVar10;
  int iVar11;
  gguf_context *ctx;
  ulong uVar12;
  long lVar13;
  ssize_t sVar14;
  int64_t iVar15;
  size_t sVar16;
  ggml_context *ctx_00;
  ggml_tensor *pgVar17;
  pointer pcVar18;
  size_t __nbytes;
  byte bVar19;
  void *extraout_RDX;
  void *__buf;
  undefined8 extraout_RDX_00;
  void *extraout_RDX_01;
  pointer __buf_00;
  pointer extraout_RDX_02;
  size_t i;
  uint uVar20;
  char *pcVar21;
  FILE *__stream;
  long lVar22;
  size_t j;
  ulong uVar23;
  long lVar24;
  gguf_reader gr;
  gguf_type type;
  uint local_1e4;
  uint64_t n;
  ulong local_1d8;
  undefined1 local_1d0 [16];
  int64_t n_tensors;
  ggml_tensor *local_1b8;
  int64_t n_kv;
  ggml_context **local_1a8;
  ulong local_1a0;
  undefined8 uStack_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  vector<char,_std::allocator<char>_> magic;
  undefined8 local_170;
  pointer local_168;
  long local_160;
  char local_88 [80];
  unsigned_long local_38;
  
  gr.file = file;
  ctx = (gguf_context *)operator_new(0x58);
  ctx->version = 3;
  (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ctx->alignment = 0x20;
  ctx->offset = 0;
  ctx->size = 0;
  ctx->data = (void *)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar8 = gguf_reader::read<char>(&gr,&magic,4);
  if (bVar8) {
    kv = &ctx->kv;
    uVar20 = 0;
    do {
      uVar12 = (ulong)uVar20;
      if ((ulong)((long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar12) {
        local_1b8 = (ggml_tensor *)file;
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&magic.super__Vector_base<char,_std::allocator<char>_>);
        n_kv = 0;
        n_tensors = 0;
        bVar8 = gguf_reader::read<unsigned_int>(&gr,(uint *)ctx);
        if (bVar8) {
          uVar20 = ctx->version;
          bVar8 = uVar20 == 1;
          if (bVar8) {
            fprintf(_stderr,
                    "%s: GGUFv1 is no longer supported, please use a more up-to-date version\n",
                    "gguf_init_from_file_impl");
            uVar20 = ctx->version;
          }
          bVar8 = !bVar8;
          uVar12 = (ulong)bVar8;
          if (uVar20 < 4) {
            if ((bVar8) && (bVar8 = gguf_reader::read<long>(&gr,&n_tensors), bVar8)) {
              if ((ulong)n_tensors < 0xbe82fa0be82fa1) {
                bVar8 = gguf_reader::read<long>(&gr,&n_kv);
                if (!bVar8) goto LAB_0013eb64;
                if ((ulong)n_kv < 0x2e8ba2e8ba2e8bb) {
                  local_1e4 = params._0_4_;
                  lVar24 = 0;
                  pcVar18 = (pointer)n_kv;
                  __buf = extraout_RDX;
                  local_1a8 = params.ctx;
                  goto LAB_0013e2da;
                }
                pcVar21 = "%s: number of key value pairs is %li but must be in [0, %zu]\n";
              }
              else {
                pcVar21 = "%s: number of tensors is %li but must be in [0, %zu]\n";
              }
              fprintf(_stderr,pcVar21,"gguf_init_from_file_impl");
            }
          }
          else {
            fprintf(_stderr,
                    "%s: this GGUF file is version %u but this software only supports up to version %d\n"
                    ,"gguf_init_from_file_impl",(ulong)uVar20,3);
          }
        }
LAB_0013eb64:
        pcVar21 = "%s: failed to read header\n";
        goto LAB_0013eb7c;
      }
      uVar20 = uVar20 + 1;
    } while (magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar12] == "GGUF"[uVar12]);
    fprintf(_stderr,"%s: invalid magic characters: \'%c%c%c%c\', expected \'GGUF\'\n",
            "gguf_init_from_file_impl",
            (ulong)(uint)(int)*magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
            (ulong)(uint)(int)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start[1],
            (ulong)(uint)(int)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start[2],
            (int)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[3]);
  }
  else {
    fprintf(_stderr,"%s: failed to read magic\n","gguf_init_from_file_impl");
  }
  gguf_free(ctx);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&magic.super__Vector_base<char,_std::allocator<char>_>);
  return (gguf_context *)0x0;
LAB_0013e2da:
  do {
    if (((uVar12 & 1) == 0) || (n_kv <= lVar24)) break;
    magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    type = ~GGUF_TYPE_UINT8;
    n = 1;
    uVar12 = gguf_reader::read(&gr,(int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&magic,__buf,(size_t)pcVar18);
    uVar12 = uVar12 & 0xffffffff;
    lVar22 = 0;
    uVar23 = 0;
    while ((uVar12 & 1) != 0) {
      pgVar2 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pgVar2;
      pcVar18 = (pointer)0x58;
      if ((ulong)(lVar13 / 0x58) <= uVar23) {
        sVar14 = gguf_reader::read(&gr,(int)&type,(void *)(lVar13 % 0x58),0x58);
        gVar6 = type;
        bVar8 = type != GGUF_TYPE_ARRAY;
        pcVar18 = (pointer)CONCAT71((int7)((ulong)pcVar18 >> 8),bVar8);
        bVar19 = type == GGUF_TYPE_ARRAY & (byte)sVar14;
        if (bVar19 == 1) {
          sVar14 = gguf_reader::read(&gr,(int)&type,
                                     (void *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),bVar19),
                                     (size_t)pcVar18);
          bVar5 = false;
          uVar12 = 0;
          if ((char)sVar14 == '\0') goto LAB_0013e5e0;
          bVar8 = gguf_reader::read<unsigned_long>(&gr,&n);
        }
        else {
          bVar8 = (bool)((byte)sVar14 & bVar8);
        }
        bVar5 = false;
        uVar12 = 0;
        if (bVar8 != false) {
          switch(type) {
          case GGUF_TYPE_UINT8:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<unsigned_char>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_INT8:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<signed_char>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_UINT16:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<unsigned_short>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_INT16:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<short>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_UINT32:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<unsigned_int>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_INT32:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<int>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_FLOAT32:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<float>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_BOOL:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<bool>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_STRING:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<std::__cxx11::string>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          default:
            uVar12 = 0;
            pcVar18 = magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            fprintf(_stderr,"%s: key \'%s\' has invalid GGUF type %d\n","gguf_init_from_file_impl");
            goto LAB_0013e5dd;
          case GGUF_TYPE_UINT64:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<unsigned_long>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_INT64:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<long>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
            break;
          case GGUF_TYPE_FLOAT64:
            pcVar18 = (pointer)(ulong)(gVar6 == GGUF_TYPE_ARRAY);
            bVar8 = gguf_read_emplace_helper<double>
                              (&gr,kv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,gVar6 == GGUF_TYPE_ARRAY,n);
            uVar20 = (uint)bVar8;
          }
          uVar12 = (ulong)uVar20;
LAB_0013e5dd:
          bVar5 = true;
        }
        goto LAB_0013e5e0;
      }
      _Var9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &magic,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&(pgVar2->key)._M_dataplus._M_p + lVar22));
      if (_Var9) {
        uVar12 = 0;
        pcVar18 = magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        fprintf(_stderr,"%s: duplicate key \'%s\' for tensors %zu and %li \n",
                "gguf_init_from_file_impl",
                magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,uVar23);
      }
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + 0x58;
    }
    bVar5 = false;
LAB_0013e5e0:
    std::__cxx11::string::~string((string *)&magic);
    lVar24 = lVar24 + 1;
    __buf = extraout_RDX_01;
  } while (bVar5);
  if ((uVar12 & 1) != 0) {
    if (((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x58 != n_kv) {
      pcVar21 = "int64_t(ctx->kv.size()) == n_kv";
      iVar11 = 0x1c7;
      goto LAB_0013f056;
    }
    iVar15 = gguf_find_key(ctx,"general.alignment");
    if ((int)iVar15 == -1) {
      pcVar18 = (pointer)0x20;
    }
    else {
      uVar10 = gguf_get_val_u32(ctx,(long)(int)iVar15);
      pcVar18 = (pointer)(ulong)uVar10;
    }
    ctx->alignment = (size_t)pcVar18;
    __buf_00 = (pointer)((ulong)pcVar18 ^ (ulong)(pcVar18 + -1));
    if (pcVar18 + -1 < __buf_00) {
      lVar24 = 0;
      do {
        if (((uVar12 & 1) == 0) || (n_tensors <= lVar24)) goto LAB_0013ec80;
        n = (uint64_t)local_1d0;
        local_1d8 = 0;
        local_1d0[0] = 0;
        uVar12 = gguf_reader::read(&gr,(int)&n,__buf_00,(size_t)pcVar18);
        uVar23 = local_1d8;
        uVar12 = uVar12 & 0xffffffff;
        if (local_1d8 < 0x40) {
          ggml_set_name((ggml_tensor *)&magic,(char *)n);
          if ((char)uVar12 != '\0') {
            lVar22 = 0x100;
            for (lVar13 = 0; lVar24 != lVar13; lVar13 = lVar13 + 1) {
              iVar11 = strcmp(local_88,(char *)((long)(((ctx->info).
                                                                                                                
                                                  super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->t).ne
                                               + lVar22 + -0x10));
              if (iVar11 == 0) {
                uVar12 = 0;
                fprintf(_stderr,"%s: duplicate tensor name \'%s\' for tensors %li and %li\n",
                        "gguf_init_from_file_impl",local_88,lVar13);
                break;
              }
              lVar22 = lVar22 + 0x158;
            }
          }
        }
        else {
          uVar12 = 0;
          fprintf(_stderr,"%s: tensor name %li is too long: %zu >= %d\n","gguf_init_from_file_impl",
                  lVar24,local_1d8);
        }
        std::__cxx11::string::~string((string *)&n);
        if ((0x3f < uVar23) || ((char)uVar12 == '\0')) goto LAB_0013ec80;
        n = CONCAT44(n._4_4_,0xffffffff);
        bVar8 = gguf_reader::read<unsigned_int>(&gr,(uint *)&n);
        if (4 < (uint)n) {
          fprintf(_stderr,"%s: tensor \'%s\' has invalid number of dimensions: %u > %u\n",
                  "gguf_init_from_file_impl",local_88);
LAB_0013ec7d:
          uVar12 = 0;
          goto LAB_0013ec80;
        }
        uVar12 = (ulong)bVar8;
        lVar22 = 0x10;
        for (uVar23 = 0; ((char)uVar12 != '\0' && (uVar23 < 4)); uVar23 = uVar23 + 1) {
          (&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage)[uVar23] = (pointer)0x1;
          if (uVar23 < (n & 0xffffffff)) {
            bVar8 = gguf_reader::read<long>
                              (&gr,(long *)((long)&magic.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar22)
                              );
            if ((long)(&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)[uVar23] < 0) {
              pcVar21 = "%s: tensor \'%s\' dimension %u has invalid number of elements: %li < 0\n";
              uVar23 = uVar23 & 0xffffffff;
              __stream = _stderr;
              goto LAB_0013ea9f;
            }
            uVar12 = (ulong)bVar8;
          }
          lVar22 = lVar22 + 8;
        }
        if ((char)uVar12 == '\0') goto LAB_0013ec80;
        if (((SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_170),0
                    ) <=
              (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) ||
            (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_168),0)
             <= (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage * local_170)) ||
           (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
           SUB168(auVar4 / SEXT816(local_160),0) <=
           (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage * local_170 * (long)local_168)) {
          fprintf(_stderr,
                  "%s: total number of elements in tensor \'%s\' with shape (%li, %li, %li, %li) is >= %li\n"
                  ,"gguf_init_from_file_impl",local_88,
                  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_170,(int)local_168,local_160,
                  0x7fffffffffffffff);
          goto LAB_0013ec7d;
        }
        pcVar18 = local_168;
        sVar14 = gguf_reader::read(&gr,(int)&magic,SUB168(auVar4 % SEXT816(local_160),0),
                                   (size_t)local_168);
        __stream = _stderr;
        gVar1 = (ggml_type)
                magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
        if (0x26 < (ggml_type)
                   magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) goto LAB_0013efe7;
        ggml_type_size((ggml_type)
                       magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        iVar15 = ggml_blck_size((ggml_type)
                                magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        __stream = _stderr;
        if ((iVar15 == 0) ||
           ((long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage % iVar15 != 0)) {
          gVar1 = (ggml_type)
                  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
          ggml_type_name((ggml_type)
                         magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
          pcVar21 = 
          "%s: tensor \'%s\' of type %d (%s) has %ld elements per row, not a multiple of block size (%ld)\n"
          ;
          goto LAB_0013f018;
        }
        for (lVar22 = 8; lVar22 != 10; lVar22 = lVar22 + 1) {
          pcVar18 = (pointer)((&n_kv)[lVar22] * *(long *)(&local_190 + lVar22 * 8));
          (&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start)[lVar22] = pcVar18;
        }
        if ((char)sVar14 == '\0') goto LAB_0013ec7d;
        bVar8 = gguf_reader::read<unsigned_long>(&gr,&local_38);
        uVar12 = (ulong)bVar8;
        std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::push_back
                  (&ctx->info,(value_type *)&magic);
        lVar24 = lVar24 + 1;
        __buf_00 = extraout_RDX_02;
      } while( true );
    }
    fprintf(_stderr,"%s: alignment %zu is not a power of 2\n","gguf_init_from_file_impl");
    goto LAB_0013eb83;
  }
  pcVar21 = "%s: failed to read key-value pairs\n";
  goto LAB_0013eb7c;
LAB_0013efe7:
  ggml_type_name((ggml_type)
                 magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  pcVar21 = "%s: tensor \'%s\' has invalid ggml type %d (%s)\n";
LAB_0013f018:
  uVar23 = (ulong)gVar1;
LAB_0013ea9f:
  uVar12 = 0;
  fprintf(__stream,pcVar21,"gguf_init_from_file_impl",local_88,uVar23);
LAB_0013ec80:
  pgVar17 = local_1b8;
  if ((uVar12 & 1) == 0) {
    pcVar21 = "%s: failed to read tensor info\n";
  }
  else {
    if (((long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x158 != n_tensors) {
      pcVar21 = "int64_t(ctx->info.size()) == n_tensors";
      iVar11 = 0x24d;
LAB_0013f056:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                 ,iVar11,"GGML_ASSERT(%s) failed",pcVar21);
    }
    lVar24 = ftell((FILE *)local_1b8);
    iVar11 = fseek((FILE *)pgVar17,-ctx->alignment & (lVar24 + ctx->alignment) - 1,0);
    uVar20 = local_1e4;
    if (iVar11 == 0) {
      sVar16 = ftell((FILE *)pgVar17);
      ctx->offset = sVar16;
      ctx->size = 0;
      lVar24 = 0x100;
      sVar16 = 0;
      for (uVar23 = 0; ppgVar7 = local_1a8, iVar15 = n_tensors,
          pgVar3 = (ctx->info).
                   super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar23 < (ulong)(((long)(ctx->info).
                                  super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pgVar3) / 0x158
                          ); uVar23 = uVar23 + 1) {
        if (*(size_t *)((long)(pgVar3->t).op_params + lVar24 + 0xfffffffffffffffcU) != sVar16) {
          fprintf(_stderr,"%s: tensor \'%s\' has offset %lu, expected %zu\n",
                  "gguf_init_from_file_impl",(long)(pgVar3->t).ne + lVar24 + -0x10);
          pcVar21 = "%s: failed to read tensor data\n";
          goto LAB_0013eb7c;
        }
        sVar16 = ggml_nbytes((ggml_tensor *)((long)pgVar3 + lVar24 + -0x100));
        sVar16 = (-ctx->alignment & (sVar16 + ctx->alignment) - 1) + ctx->size;
        ctx->size = sVar16;
        lVar24 = lVar24 + 0x158;
      }
      if (local_1a8 == (ggml_context **)0x0) {
        return ctx;
      }
      if ((uVar20 & 1) == 0) {
        lVar24 = n_tensors + 1;
        sVar16 = ggml_tensor_overhead();
        local_1a0 = sVar16 * lVar24 + ctx->size;
      }
      else {
        sVar16 = ggml_tensor_overhead();
        local_1a0 = sVar16 * iVar15;
      }
      __nbytes = (ulong)uVar20 & 0xffffffffffffff01;
      uStack_198 = 0;
      local_190 = (undefined1)__nbytes;
      params_00._17_7_ = uStack_18f;
      params_00.no_alloc = (_Bool)local_190;
      params_00.mem_buffer = (void *)0x0;
      params_00.mem_size = local_1a0;
      ctx_00 = ggml_init(params_00);
      *ppgVar7 = ctx_00;
      if (ctx_00 != (ggml_context *)0x0) {
        if ((uVar20 & 1) == 0) {
          pgVar17 = ggml_new_tensor_1d(ctx_00,GGML_TYPE_I8,ctx->size);
          if (pgVar17 != (ggml_tensor *)0x0) {
            ggml_set_name(pgVar17,"GGUF tensor data binary blob");
            sVar14 = gguf_reader::read(&gr,(int)pgVar17->data,(void *)ctx->size,__nbytes);
            if ((char)sVar14 != '\0') {
              ctx->data = pgVar17->data;
              uVar12 = 1;
              local_1b8 = pgVar17;
              goto LAB_0013ee3b;
            }
          }
          fprintf(_stderr,"%s: failed to read tensor data binary blob\n","gguf_init_from_file_impl")
          ;
          ggml_free(ctx_00);
          *ppgVar7 = (ggml_context *)0x0;
        }
        else {
          local_1b8 = (ggml_tensor *)0x0;
LAB_0013ee3b:
          ggml_set_no_alloc(ctx_00,true);
          lVar24 = 0x100;
          uVar23 = 0;
          while( true ) {
            pgVar3 = (ctx->info).
                     super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl
                     .super__Vector_impl_data._M_start;
            if ((ulong)(((long)(ctx->info).
                               super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pgVar3) / 0x158)
                <= uVar23) break;
            pgVar17 = ggml_new_tensor(ctx_00,*(ggml_type *)((long)pgVar3 + lVar24 + -0x100),4,
                                      (int64_t *)((long)pgVar3 + lVar24 + -0xf0));
            if (((byte)uVar12 & pgVar17 != (ggml_tensor *)0x0) != 1) goto LAB_0013ef31;
            ggml_set_name(pgVar17,(char *)((long)(pgVar3->t).ne + lVar24 + -0x10));
            if ((local_1e4 & 1) == 0) {
              pgVar17->data =
                   (void *)((long)local_1b8->data +
                           *(long *)((long)(pgVar3->t).op_params + lVar24 + 0xfffffffffffffffcU));
            }
            uVar23 = uVar23 + 1;
            lVar24 = lVar24 + 0x158;
            uVar12 = 1;
          }
          if ((uVar12 & 1) != 0) {
            ggml_set_no_alloc(ctx_00,(_Bool)((byte)local_1e4 & 1));
            return ctx;
          }
LAB_0013ef31:
          fprintf(_stderr,"%s: failed to create tensors\n","gguf_init_from_file_impl");
          ggml_free(ctx_00);
          *local_1a8 = (ggml_context *)0x0;
        }
        goto LAB_0013eb83;
      }
      pcVar21 = "%s: failed to initialize ggml context for storing tensors\n";
    }
    else {
      pcVar21 = "%s: failed to seek to beginning of data section\n";
    }
  }
LAB_0013eb7c:
  fprintf(_stderr,pcVar21,"gguf_init_from_file_impl");
LAB_0013eb83:
  gguf_free(ctx);
  return (gguf_context *)0x0;
}

Assistant:

struct gguf_context * gguf_init_from_file_impl(FILE * file, struct gguf_init_params params) {
    const struct gguf_reader gr(file);
    struct gguf_context * ctx = new gguf_context;

    bool ok = true;

    // file magic
    {
        std::vector<char> magic;
        ok = ok && gr.read(magic, 4);

        if (!ok) {
            fprintf(stderr, "%s: failed to read magic\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        for (uint32_t i = 0; i < magic.size(); i++) {
            if (magic[i] != GGUF_MAGIC[i]) {
                fprintf(stderr, "%s: invalid magic characters: '%c%c%c%c', expected 'GGUF'\n", __func__, magic[0], magic[1], magic[2], magic[3]);
                gguf_free(ctx);
                return nullptr;
            }
        }
    }

    // header
    int64_t n_kv      = 0;
    int64_t n_tensors = 0;

    if (ok && gr.read(ctx->version)) {
        if (ctx->version == 1) {
            fprintf(stderr, "%s: GGUFv1 is no longer supported, please use a more up-to-date version\n", __func__);
            ok = false;
        }
        if (ctx->version > GGUF_VERSION) {
            fprintf(stderr, "%s: this GGUF file is version %" PRIu32 " but this software only supports up to version %d\n",
                __func__, ctx->version, GGUF_VERSION);
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_tensors)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_tensors < 0 || n_tensors > int64_t(SIZE_MAX/sizeof(gguf_tensor_info))) {
            fprintf(stderr, "%s: number of tensors is %" PRIi64 " but must be in [0, %zu]\n",
                __func__, n_tensors, SIZE_MAX/sizeof(gguf_tensor_info));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_kv)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_kv < 0 || n_kv > int64_t(SIZE_MAX/sizeof(gguf_kv))) {
            fprintf(stderr, "%s: number of key value pairs is %" PRIi64 " but must be in [0, %zu]\n",
                    __func__, n_kv, SIZE_MAX/sizeof(gguf_kv));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read header\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // KV pairs
    {
        for (int64_t i = 0; ok && i < n_kv; ++i) {
            std::string key;
            gguf_type   type     = gguf_type(-1);
            bool        is_array = false;
            uint64_t    n        = 1;

            try {
                ok = ok && gr.read(key);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            for (size_t j = 0; ok && j < ctx->kv.size(); ++j) {
                if (key == ctx->kv[j].key) {
                    fprintf(stderr, "%s: duplicate key '%s' for tensors %zu and %" PRIi64 " \n", __func__, key.c_str(), j, i);
                    ok = false;
                }
            }
            if (!ok) {
                break;
            }

            ok = ok && gr.read(type);
            if (type == GGUF_TYPE_ARRAY) {
                is_array = true;
                ok = ok && gr.read(type);
                ok = ok && gr.read(n);
            }
            if (!ok) {
                break;
            }

            switch (type) {
                case GGUF_TYPE_UINT8:   ok = ok && gguf_read_emplace_helper<uint8_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT8:    ok = ok && gguf_read_emplace_helper<int8_t>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT16:  ok = ok && gguf_read_emplace_helper<uint16_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT16:   ok = ok && gguf_read_emplace_helper<int16_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT32:  ok = ok && gguf_read_emplace_helper<uint32_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT32:   ok = ok && gguf_read_emplace_helper<int32_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT32: ok = ok && gguf_read_emplace_helper<float>      (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_BOOL:    ok = ok && gguf_read_emplace_helper<bool>       (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_STRING:  ok = ok && gguf_read_emplace_helper<std::string>(gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT64:  ok = ok && gguf_read_emplace_helper<uint64_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT64:   ok = ok && gguf_read_emplace_helper<int64_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT64: ok = ok && gguf_read_emplace_helper<double>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_ARRAY:
                default:
                    {
                        fprintf(stderr, "%s: key '%s' has invalid GGUF type %d\n", __func__, key.c_str(), type);
                        ok = false;
                    } break;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to read key-value pairs\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }
        GGML_ASSERT(int64_t(ctx->kv.size()) == n_kv);

        const int alignment_idx = gguf_find_key(ctx, GGUF_KEY_GENERAL_ALIGNMENT);
        ctx->alignment = alignment_idx == -1 ? GGUF_DEFAULT_ALIGNMENT : gguf_get_val_u32(ctx, alignment_idx);

        if (ctx->alignment == 0 || (ctx->alignment & (ctx->alignment - 1)) != 0) {
            fprintf(stderr, "%s: alignment %zu is not a power of 2\n", __func__, ctx->alignment);
            gguf_free(ctx);
            return nullptr;
        }
    }

    // read the tensor info
    for (int64_t i = 0; ok && i < n_tensors; ++i) {
        struct gguf_tensor_info info;

        // tensor name
        {
            std::string name;
            try {
                ok = ok && gr.read(name);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            if (name.length() >= GGML_MAX_NAME) {
                fprintf(stderr, "%s: tensor name %" PRIi64 " is too long: %zu >= %d\n", __func__, i, name.length(), GGML_MAX_NAME);
                ok = false;
                break;
            }
            ggml_set_name(&info.t, name.c_str());

            // make sure there are no duplicate tensor names
            for (int64_t j = 0; ok && j < i; ++j) {
                if (strcmp(info.t.name, ctx->info[j].t.name) == 0) {
                    fprintf(stderr, "%s: duplicate tensor name '%s' for tensors %" PRIi64 " and %" PRIi64 "\n", __func__, info.t.name, j, i);
                    ok = false;
                    break;
                }
            }
        }
        if (!ok) {
            break;
        }

        // tensor shape
        {
            uint32_t n_dims = -1;
            ok = ok && gr.read(n_dims);
            if (n_dims > GGML_MAX_DIMS) {
                fprintf(stderr, "%s: tensor '%s' has invalid number of dimensions: %" PRIu32 " > %" PRIu32 "\n",
                    __func__, info.t.name, n_dims, GGML_MAX_DIMS);
                ok = false;
                break;
            }
            for (uint32_t j = 0; ok && j < GGML_MAX_DIMS; ++j) {
                info.t.ne[j] = 1;
                if (j < n_dims) {
                    ok = ok && gr.read(info.t.ne[j]);
                }

                // check that all ne are non-negative
                if (info.t.ne[j] < 0) {
                    fprintf(stderr, "%s: tensor '%s' dimension %" PRIu32 " has invalid number of elements: %" PRIi64 " < 0\n",
                        __func__, info.t.name, j, info.t.ne[j]);
                    ok = false;
                    break;
                }
            }

            // check that the total number of elements is representable
            if (ok && ((INT64_MAX/info.t.ne[1] <= info.t.ne[0]) ||
                       (INT64_MAX/info.t.ne[2] <= info.t.ne[0]*info.t.ne[1]) ||
                       (INT64_MAX/info.t.ne[3] <= info.t.ne[0]*info.t.ne[1]*info.t.ne[2]))) {

                fprintf(stderr, "%s: total number of elements in tensor '%s' with shape "
                    "(%" PRIi64 ", %" PRIi64 ", %" PRIi64 ", %" PRIi64 ") is >= %" PRIi64 "\n",
                    __func__, info.t.name, info.t.ne[0], info.t.ne[1], info.t.ne[2], info.t.ne[3], INT64_MAX);
                ok = false;
                break;
            }
        }
        if (!ok) {
            break;
        }

        // tensor type
        {
            ok = ok && gr.read(info.t.type);

            // check that tensor type is within defined range
            if (info.t.type < 0 || info.t.type >= GGML_TYPE_COUNT) {
                fprintf(stderr, "%s: tensor '%s' has invalid ggml type %d (%s)\n",
                    __func__, info.t.name, info.t.type, ggml_type_name(info.t.type));
                ok = false;
                break;
            }
            const size_t  type_size = ggml_type_size(info.t.type);
            const int64_t blck_size = ggml_blck_size(info.t.type);

            // check that row size is divisible by block size
            if (blck_size == 0 || info.t.ne[0] % blck_size != 0) {
                fprintf(stderr, "%s: tensor '%s' of type %d (%s) has %" PRId64 " elements per row, "
                    "not a multiple of block size (%" PRId64 ")\n",
                    __func__, info.t.name, (int) info.t.type, ggml_type_name(info.t.type), info.t.ne[0], blck_size);
                ok = false;
                break;
            }

            // calculate byte offsets given the tensor shape and type
            info.t.nb[0] = type_size;
            info.t.nb[1] = info.t.nb[0]*(info.t.ne[0]/blck_size);
            for (int j = 2; j < GGML_MAX_DIMS; ++j) {
                info.t.nb[j] = info.t.nb[j - 1]*info.t.ne[j - 1];
            }
        }
        if (!ok) {
            break;
        }

        // tensor data offset within buffer
        ok = ok && gr.read(info.offset);

        ctx->info.push_back(info);
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read tensor info\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }
    GGML_ASSERT(int64_t(ctx->info.size()) == n_tensors);

    // we require the data section to be aligned, so take into account any padding
    if (fseek(file, GGML_PAD(ftell(file), ctx->alignment), SEEK_SET) != 0) {
        fprintf(stderr, "%s: failed to seek to beginning of data section\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // store the current file offset - this is where the data section starts
    ctx->offset = ftell(file);

    // compute the total size of the data section, taking into account the alignment
    {
        ctx->size = 0;
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const gguf_tensor_info & ti = ctx->info[i];
            if (ti.offset != ctx->size) {
                fprintf(stderr, "%s: tensor '%s' has offset %" PRIu64 ", expected %zu\n",
                    __func__, ti.t.name, ti.offset, ctx->size);
                fprintf(stderr, "%s: failed to read tensor data\n", __func__);
                gguf_free(ctx);
                return nullptr;
            }
            ctx->size += GGML_PAD(ggml_nbytes(&ti.t), ctx->alignment);
        }
    }

    // load the tensor data only if requested
    if (params.ctx != nullptr) {
        // if the provided gguf_context is no_alloc, then we create "empty" tensors and do not read the binary blob
        // otherwise, we load the binary blob into the created ggml_context as well, and point the "data" members of
        //   the ggml_tensor structs to the appropriate locations in the binary blob

        // compute the exact size needed for the new ggml_context
        const size_t mem_size =
            params.no_alloc ?
            (n_tensors    )*ggml_tensor_overhead() :
            (n_tensors + 1)*ggml_tensor_overhead() + ctx->size;

        struct ggml_init_params pdata = {
            /*mem_size   =*/ mem_size,
            /*mem_buffer =*/ nullptr,
            /*no_alloc   =*/ params.no_alloc,
        };

        *params.ctx = ggml_init(pdata);
        if (*params.ctx == nullptr) {
            fprintf(stderr, "%s: failed to initialize ggml context for storing tensors\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        struct ggml_context * ctx_data = *params.ctx;

        struct ggml_tensor * data = nullptr;

        if (!params.no_alloc) {
            data = ggml_new_tensor_1d(ctx_data, GGML_TYPE_I8, ctx->size);

            ok = ok && data != nullptr;

            if (ok) {
                ggml_set_name(data, "GGUF tensor data binary blob");
            }

            // read the binary blob with the tensor data
            ok = ok && gr.read(data->data, ctx->size);

            if (!ok) {
                fprintf(stderr, "%s: failed to read tensor data binary blob\n", __func__);
                ggml_free(ctx_data);
                *params.ctx = nullptr;
                gguf_free(ctx);
                return nullptr;
            }

            ctx->data = data->data;
        }

        ggml_set_no_alloc(ctx_data, true);

        // create the tensors
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const struct gguf_tensor_info & info = ctx->info[i];

            struct ggml_tensor * cur = ggml_new_tensor(ctx_data, info.t.type, GGML_MAX_DIMS, info.t.ne);

            ok = ok && cur != nullptr;

            if (!ok) {
                break;
            }

            ggml_set_name(cur, info.t.name);

            // point the data member to the appropriate location in the binary blob using the tensor info
            if (!params.no_alloc) {
                cur->data = (char *) data->data + info.offset;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to create tensors\n", __func__);
            ggml_free(ctx_data);
            *params.ctx = nullptr;
            gguf_free(ctx);
            return nullptr;
        }

        ggml_set_no_alloc(ctx_data, params.no_alloc);
    }

    return ctx;
}